

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O1

void Exa_ManPrintSolution(Exa_Man_t *p,int fCompl)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  int iVar9;
  int (*paiVar10) [32];
  ulong uVar11;
  bool bVar12;
  int (*local_38) [32];
  
  printf("Realization of given %d-input function using %d two-input gates:\n",(ulong)(uint)p->nVars,
         (ulong)(uint)p->nNodes);
  iVar9 = p->nObjs;
  uVar11 = (ulong)(uint)p->nVars;
  if (p->nVars < iVar9) {
    local_38 = p->VarMarks[(long)iVar9 + -1] + 1;
    lVar5 = (long)iVar9;
    do {
      lVar1 = lVar5 + -1;
      iVar9 = (int)lVar1 - (int)uVar11;
      uVar2 = bmcg_sat_solver_read_cex_varvalue(p->pSat,iVar9 * 3 + 1);
      uVar3 = bmcg_sat_solver_read_cex_varvalue(p->pSat,iVar9 * 3 + 2);
      uVar4 = bmcg_sat_solver_read_cex_varvalue(p->pSat,iVar9 * 3 + 3);
      if ((fCompl == 0) || (p->nObjs != (int)lVar5)) {
        pcVar7 = "%02d = 4\'b%d%d%d0(";
        uVar6 = (ulong)uVar4;
        uVar11 = (ulong)uVar3;
        uVar8 = (ulong)uVar2;
      }
      else {
        uVar6 = (ulong)(uVar4 == 0);
        uVar11 = (ulong)(uVar3 == 0);
        uVar8 = (ulong)(uVar2 == 0);
        pcVar7 = "%02d = 4\'b%d%d%d1(";
      }
      printf(pcVar7,lVar1,uVar6,uVar11,uVar8);
      lVar5 = 1;
      paiVar10 = local_38;
      do {
        uVar2 = 0;
        if (p->nObjs < 1) {
          uVar11 = 0xffffffff;
        }
        else {
          uVar11 = 0xffffffff;
          uVar6 = 0;
          do {
            if ((*paiVar10)[uVar6] != 0) {
              iVar9 = bmcg_sat_solver_read_cex_varvalue(p->pSat,(*paiVar10)[uVar6]);
              if (iVar9 != 0) {
                uVar11 = uVar6 & 0xffffffff;
              }
              uVar2 = uVar2 + (iVar9 != 0);
            }
            uVar6 = uVar6 + 1;
          } while ((long)uVar6 < (long)p->nObjs);
          uVar2 = (uint)(uVar2 == 1);
        }
        if ((char)uVar2 == '\0') {
          __assert_fail("Count == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                        ,0x218,"int Exa_ManFindFanin(Exa_Man_t *, int, int)");
        }
        iVar9 = (int)uVar11;
        if ((iVar9 < 0) || (p->nVars <= iVar9)) {
          pcVar7 = " %02d";
        }
        else {
          uVar11 = (ulong)(iVar9 + 0x61);
          pcVar7 = " %c";
        }
        printf(pcVar7,uVar11);
        paiVar10 = paiVar10 + -1;
        bVar12 = lVar5 != 0;
        lVar5 = lVar5 + -1;
      } while (bVar12);
      puts(" )");
      uVar11 = (ulong)p->nVars;
      local_38 = local_38 + -2;
      lVar5 = lVar1;
    } while ((long)uVar11 < lVar1);
  }
  return;
}

Assistant:

void Exa_ManPrintSolution( Exa_Man_t * p, int fCompl )
{
    int i, k, iVar;
    printf( "Realization of given %d-input function using %d two-input gates:\n", p->nVars, p->nNodes );
//    for ( i = p->nVars + 2; i < p->nObjs; i++ )
    for ( i = p->nObjs - 1; i >= p->nVars; i-- )
    {
        int iVarStart = 1 + 3*(i - p->nVars);
        int Val1 = bmcg_sat_solver_read_cex_varvalue(p->pSat, iVarStart);
        int Val2 = bmcg_sat_solver_read_cex_varvalue(p->pSat, iVarStart+1);
        int Val3 = bmcg_sat_solver_read_cex_varvalue(p->pSat, iVarStart+2);
        if ( i == p->nObjs - 1 && fCompl )
            printf( "%02d = 4\'b%d%d%d1(", i, !Val3, !Val2, !Val1 );
        else
            printf( "%02d = 4\'b%d%d%d0(", i, Val3, Val2, Val1 );
        for ( k = 1; k >= 0; k-- )
        {
            iVar = Exa_ManFindFanin( p, i, k );
            if ( iVar >= 0 && iVar < p->nVars )
                printf( " %c", 'a'+iVar );
            else
                printf( " %02d", iVar );
        }
        printf( " )\n" );
    }
}